

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::FragDepthCompareCase::iterate(FragDepthCompareCase *this)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  code *pcVar2;
  EvalFragDepthFunc p_Var3;
  undefined *puVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  TestLog *log_00;
  RenderContext *pRVar13;
  deUint32 extraout_var;
  char *pcVar14;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  TestError *pTVar15;
  float fVar16;
  char *local_a78;
  VertexArrayBinding *local_990;
  RGBA local_7fc;
  bool isOk;
  bool dpass_1;
  float local_7ec;
  float local_7e8;
  float d_1;
  float rd;
  float xh;
  float xf_1;
  int x_1;
  bool dpass;
  float local_7c8;
  float local_7c4;
  float d;
  float xf;
  int x;
  int half;
  float yf;
  int y;
  PrimitiveList local_788;
  undefined1 local_76a;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  void **local_720;
  undefined1 local_718 [8];
  VertexArrayBinding vertexArrays [2];
  float position [16];
  float coord [8];
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  ProgramSources local_5c8;
  undefined1 local_4f8 [8];
  ShaderProgram program;
  allocator<char> local_409;
  string local_408;
  undefined1 local_3e8 [8];
  VertexArrayBinding posBinding_1;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  VertexArrayBinding posBinding;
  float varyingDepthCoord [16];
  float constDepthCoord [16];
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  ProgramSources local_230;
  undefined1 local_160 [8];
  ShaderProgram basicQuadProgram;
  undefined1 local_88 [4];
  float constDepth;
  Surface referenceFrame;
  Surface renderedFrame;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Random rnd;
  Functions *gl;
  TestLog *log;
  FragDepthCompareCase *this_local;
  RenderTarget *this_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar13->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  pcVar14 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar14);
  de::Random::Random((Random *)&renderTarget,dVar6);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar13->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var_00,iVar7);
  iVar7 = tcu::RenderTarget::getWidth(this_00);
  iVar7 = de::min<int>(0x80,iVar7);
  iVar8 = tcu::RenderTarget::getHeight(this_00);
  iVar8 = de::min<int>(0x80,iVar8);
  iVar9 = tcu::RenderTarget::getWidth(this_00);
  iVar9 = de::Random::getInt((Random *)&renderTarget,0,iVar9 - iVar7);
  iVar10 = tcu::RenderTarget::getHeight(this_00);
  iVar10 = de::Random::getInt((Random *)&renderTarget,0,iVar10 - iVar8);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,iVar7,iVar8);
  tcu::Surface::Surface((Surface *)local_88,iVar7,iVar8);
  basicQuadProgram.m_program.m_info.linkTimeUs._4_4_ = 0x3dcccccd;
  iVar11 = tcu::RenderTarget::getDepthBits(this_00);
  if (iVar11 == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x8a);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))(iVar9,iVar10,iVar7,iVar8);
  (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4500);
  (**(code **)(rnd.m_rnd._8_8_ + 0x5e0))(0xb71);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  puVar4 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,puVar4,&local_251);
  puVar4 = s_defaultFragmentShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,puVar4,&local_279);
  glu::makeVtxFragSources(&local_230,&local_250,&local_278);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_160,pRVar13,&local_230);
  glu::ProgramSources::~ProgramSources(&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_160);
  if (!bVar5) {
    glu::operator<<(log_00,(ShaderProgram *)local_160);
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x99);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  varyingDepthCoord[0xe] = -1.0;
  varyingDepthCoord[0xf] = -1.0;
  varyingDepthCoord[10] = 1.0;
  varyingDepthCoord[0xb] = 1.0;
  varyingDepthCoord[0xc] = -1.0;
  varyingDepthCoord[0xd] = 1.0;
  varyingDepthCoord[6] = 1.0;
  varyingDepthCoord[7] = -1.0;
  varyingDepthCoord[8] = 0.0;
  varyingDepthCoord[9] = 1.0;
  varyingDepthCoord[2] = 0.0;
  varyingDepthCoord[3] = 1.0;
  varyingDepthCoord[4] = 0.0;
  varyingDepthCoord[5] = 1.0;
  posBinding.pointer.data = (void *)0xbf80000000000000;
  varyingDepthCoord[0] = 1.0;
  varyingDepthCoord[1] = 1.0;
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  (*pcVar1)(dVar6);
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a0);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  uVar12 = (*pcVar2)(dVar6,"u_color");
  (*pcVar1)(0,0,0x3f800000,uVar12);
  (**(code **)(rnd.m_rnd._8_8_ + 0x4a0))(0x207);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"a_position",&local_379);
  glu::va::Float((VertexArrayBinding *)local_358,&local_378,4,4,0,varyingDepthCoord + 0xe);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles((PrimitiveList *)&posBinding_1.pointer.data,6,iterate::quadIndices);
  glu::draw(pRVar13,dVar6,1,(VertexArrayBinding *)local_358,
            (PrimitiveList *)&posBinding_1.pointer.data,(DrawUtilCallback *)0x0);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"a_position",&local_409);
  glu::va::Float((VertexArrayBinding *)local_3e8,&local_408,4,4,0,(float *)&posBinding.pointer.data)
  ;
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles((PrimitiveList *)&program.m_program.m_info.linkTimeUs,6,iterate::quadIndices);
  glu::draw(pRVar13,dVar6,1,(VertexArrayBinding *)local_3e8,
            (PrimitiveList *)&program.m_program.m_info.linkTimeUs,(DrawUtilCallback *)0x0);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_3e8);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Draw base quads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0xbb);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_160);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  puVar4 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,puVar4,&local_5e9);
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,pcVar14,(allocator<char> *)((long)coord + 0x1f));
  glu::makeVtxFragSources(&local_5c8,&local_5e8,&local_610);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4f8,pRVar13,&local_5c8);
  glu::ProgramSources::~ProgramSources(&local_5c8);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)((long)coord + 0x1f));
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  glu::operator<<(log_00,(ShaderProgram *)local_4f8);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_4f8);
  if (!bVar5) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0xc4);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  coord[2] = 1.0;
  coord[3] = 0.0;
  coord[4] = 1.0;
  coord[5] = 1.0;
  position[0xe] = 0.0;
  position[0xf] = 0.0;
  coord[0] = 0.0;
  coord[1] = 1.0;
  position[10] = 1.0;
  position[0xb] = 1.0;
  position[0xc] = -1.0;
  position[0xd] = 1.0;
  position[6] = 1.0;
  position[7] = -1.0;
  position[8] = 0.0;
  position[9] = 1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  position[4] = 0.0;
  position[5] = 1.0;
  vertexArrays[1].pointer.data = (void *)0xbf800000bf800000;
  position[0] = 1.0;
  position[1] = 1.0;
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4f8);
  (*pcVar1)(dVar6);
  (**(code **)(rnd.m_rnd._8_8_ + 0x4a0))(this->m_compareFunc);
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x15a0);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4f8);
  uVar12 = (*pcVar2)(dVar6,"u_color");
  (*pcVar1)(0,0x3f800000,uVar12);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4f8);
  deqp::gls::setupDefaultUniforms(pRVar13,dVar6);
  local_76a = 1;
  local_720 = (void **)local_718;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"a_position",&local_741);
  glu::va::Float((VertexArrayBinding *)local_718,&local_740,4,4,0,
                 (float *)&vertexArrays[1].pointer.data);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_720 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"a_coord",&local_769);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_768,2,4,0,position + 0xe);
  local_76a = 0;
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4f8);
  glu::pr::Triangles(&local_788,6,iterate::quadIndices);
  glu::draw(pRVar13,dVar6,2,(VertexArrayBinding *)local_718,&local_788,(DrawUtilCallback *)0x0);
  local_990 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_990 = local_990 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_990);
  } while (local_990 != (VertexArrayBinding *)local_718);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0xe6);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4f8);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&yf,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar13,iVar9,iVar10,(PixelBufferAccess *)&yf);
  for (half = 0; iVar7 = half, iVar8 = tcu::Surface::getHeight((Surface *)local_88), iVar7 < iVar8;
      half = half + 1) {
    fVar16 = (float)half;
    iVar7 = tcu::Surface::getHeight((Surface *)local_88);
    x = (int)((fVar16 + 0.5) / (float)iVar7);
    iVar7 = tcu::Surface::getWidth((Surface *)local_88);
    iVar8 = tcu::Surface::getWidth((Surface *)local_88);
    xf = (float)de::clamp<int>((int)((float)iVar7 * 0.5 + 0.5),0,iVar8);
    for (d = 0.0; (int)d < (int)xf; d = (float)((int)d + 1)) {
      fVar16 = (float)(int)d;
      iVar7 = tcu::Surface::getWidth((Surface *)local_88);
      local_7c4 = (fVar16 + 0.5) / (float)iVar7;
      p_Var3 = this->m_evalFunc;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xfffffffffffff830,local_7c4,(float)x)
      ;
      local_7c8 = (*p_Var3)((Vec2 *)&stack0xfffffffffffff830);
      x_1._3_1_ = compare<float>(this->m_compareFunc,local_7c8,0.55);
      iVar7 = half;
      fVar16 = d;
      if ((bool)x_1._3_1_) {
        xf_1 = (float)tcu::RGBA::green();
      }
      else {
        xf_1 = (float)tcu::RGBA::blue();
      }
      tcu::Surface::setPixel((Surface *)local_88,(int)fVar16,iVar7,(RGBA)xf_1);
    }
    for (xh = xf; fVar16 = xh, iVar7 = tcu::Surface::getWidth((Surface *)local_88),
        (int)fVar16 < iVar7; xh = (float)((int)xh + 1)) {
      fVar16 = (float)(int)xh;
      iVar7 = tcu::Surface::getWidth((Surface *)local_88);
      rd = (fVar16 + 0.5) / (float)iVar7;
      iVar7 = (int)xh - (int)xf;
      iVar8 = tcu::Surface::getWidth((Surface *)local_88);
      d_1 = ((float)iVar7 + 0.5) / (float)(iVar8 - (int)xf);
      local_7e8 = (d_1 + (float)x) * -0.5 + 1.0;
      p_Var3 = this->m_evalFunc;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xfffffffffffff80c,rd,(float)x);
      local_7ec = (*p_Var3)((Vec2 *)&stack0xfffffffffffff80c);
      bVar5 = compare<float>(this->m_compareFunc,local_7ec,local_7e8);
      iVar7 = half;
      fVar16 = xh;
      if (bVar5) {
        local_7fc = tcu::RGBA::green();
      }
      else {
        local_7fc = tcu::RGBA::blue();
      }
      tcu::Surface::setPixel((Surface *)local_88,(int)fVar16,iVar7,local_7fc);
    }
  }
  bVar5 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",(Surface *)local_88,
                            (Surface *)&referenceFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  if (bVar5) {
    local_a78 = "Pass";
  }
  else {
    local_a78 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,local_a78);
  tcu::Surface::~Surface((Surface *)local_88);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)&renderTarget);
  return STOP;
}

Assistant:

FragDepthCompareCase::IterateResult FragDepthCompareCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const float					constDepth		= 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		glu::ShaderProgram basicQuadProgram(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));

		if (!basicQuadProgram.isOk())
		{
			log << basicQuadProgram;
			TCU_FAIL("Compile failed");
		}

		const float constDepthCoord[] =
		{
			-1.0f, -1.0f, constDepth, 1.0f,
			-1.0f, +1.0f, constDepth, 1.0f,
			 0.0f, -1.0f, constDepth, 1.0f,
			 0.0f, +1.0f, constDepth, 1.0f
		};
		const float varyingDepthCoord[] =
		{
			 0.0f, -1.0f, +1.0f, 1.0f,
			 0.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(basicQuadProgram.getProgram());
		gl.uniform4f(gl.getUniformLocation(basicQuadProgram.getProgram(), "u_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.depthFunc(GL_ALWAYS);

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &constDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &varyingDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw base quads");
	}

	// Render with depth test.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.depthFunc(m_compareFunc);
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int		half	= de::clamp((int)((float)referenceFrame.getWidth()*0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	d		= m_evalFunc(Vec2(xf, yf));
			bool	dpass	= compare(m_compareFunc, d, constDepth*0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	xh		= ((float)(x - half) + 0.5f) / (float)(referenceFrame.getWidth()-half);
			float	rd		= 1.0f - (xh + yf) * 0.5f;
			float	d		= m_evalFunc(Vec2(xf, yf));
			bool	dpass	= compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}